

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdatetimeedit_p.cpp
# Opt level: O1

void QCalendarPopup::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  offset_in_QCalendarPopup_to_subr *candidate;
  undefined4 uVar2;
  void **ppvVar3;
  int iVar4;
  long in_FS_OFFSET;
  undefined8 local_30;
  void *local_28;
  undefined8 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    plVar1 = (long *)_a[1];
    if ((((((code *)*plVar1 == activated) && (uVar2 = 0, plVar1[1] == 0)) ||
         (((code *)*plVar1 == newDateSelected && (uVar2 = 1, plVar1[1] == 0)))) ||
        (((code *)*plVar1 == hidingCalendar && (uVar2 = 2, plVar1[1] == 0)))) ||
       (((code *)*plVar1 == resetButton && (uVar2 = 3, plVar1[1] == 0)))) {
      *(undefined4 *)*_a = uVar2;
    }
    goto LAB_003f2534;
  }
  if (_c != InvokeMetaMethod) goto LAB_003f2534;
  switch(_id) {
  case 0:
    local_30 = *_a[1];
    puStack_20 = &local_30;
    ppvVar3 = &local_28;
    local_28 = (void *)0x0;
    iVar4 = 0;
    break;
  case 1:
    local_30 = *_a[1];
    puStack_20 = &local_30;
    ppvVar3 = &local_28;
    local_28 = (void *)0x0;
    iVar4 = 1;
    break;
  case 2:
    local_30 = *_a[1];
    puStack_20 = &local_30;
    ppvVar3 = &local_28;
    local_28 = (void *)0x0;
    iVar4 = 2;
    break;
  case 3:
    iVar4 = 3;
    ppvVar3 = (void **)0x0;
    break;
  case 4:
    dateSelected((QCalendarPopup *)_o,(QDate)*_a[1]);
    goto LAB_003f2534;
  case 5:
    dateSelectionChanged((QCalendarPopup *)_o);
  default:
    goto LAB_003f2534;
  }
  QMetaObject::activate(_o,&staticMetaObject,iVar4,ppvVar3);
LAB_003f2534:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarPopup::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QCalendarPopup *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->activated((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 1: _t->newDateSelected((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 2: _t->hidingCalendar((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 3: _t->resetButton(); break;
        case 4: _t->dateSelected((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 5: _t->dateSelectionChanged(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QCalendarPopup::*)(QDate )>(_a, &QCalendarPopup::activated, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCalendarPopup::*)(QDate )>(_a, &QCalendarPopup::newDateSelected, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCalendarPopup::*)(QDate )>(_a, &QCalendarPopup::hidingCalendar, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCalendarPopup::*)()>(_a, &QCalendarPopup::resetButton, 3))
            return;
    }
}